

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3cd78e::Pl_Track::~Pl_Track(Pl_Track *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_Track(char const* identifier, Pipeline* next) :
            Pipeline(identifier, next)
        {
            if (!next) {
                throw std::logic_error("Attempt to create Pl_Track with nullptr as next");
            }
        }